

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

bool __thiscall QThreadPool::contains(QThreadPool *this,QThread *thread)

{
  QObjectData *pQVar1;
  bool bVar2;
  QThreadPoolThread *pQVar3;
  long in_FS_OFFSET;
  QThreadPoolThread *local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  pQVar3 = QtPrivate::qobject_cast_helper<QThreadPoolThread_const*,QObject_const>
                     (&thread->super_QObject);
  if (pQVar3 == (QThreadPoolThread *)0x0) {
    bVar2 = false;
  }
  else {
    local_30._0_8_ = &pQVar1[1].children.d.size;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    local_38 = pQVar3;
    bVar2 = QHash<QThreadPoolThread_*,_QHashDummyValue>::contains
                      ((QHash<QThreadPoolThread_*,_QHashDummyValue> *)&pQVar1[1].field_0x30,
                       &local_38);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::contains(const QThread *thread) const
{
    Q_D(const QThreadPool);
    const QThreadPoolThread *poolThread = qobject_cast<const QThreadPoolThread *>(thread);
    if (!poolThread)
        return false;
    QMutexLocker locker(&d->mutex);
    return d->allThreads.contains(const_cast<QThreadPoolThread *>(poolThread));
}